

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O2

int kinLsBandDQJac(N_Vector u,N_Vector fu,SUNMatrix Jac,KINMem kin_mem,N_Vector tmp1,N_Vector tmp2)

{
  long *plVar1;
  void *pvVar2;
  int iVar3;
  sunindextype sVar4;
  sunindextype sVar5;
  sunindextype sVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  sunrealtype *psVar15;
  sunindextype sVar16;
  long lVar17;
  long lVar18;
  long j;
  long lVar19;
  double dVar20;
  double dVar21;
  long local_98;
  
  pvVar2 = kin_mem->kin_lmem;
  sVar4 = SUNBandMatrix_Columns(Jac);
  sVar5 = SUNBandMatrix_UpperBandwidth(Jac);
  sVar6 = SUNBandMatrix_LowerBandwidth(Jac);
  lVar7 = N_VGetArrayPointer(fu);
  lVar8 = N_VGetArrayPointer(tmp1);
  lVar9 = N_VGetArrayPointer(u);
  lVar10 = N_VGetArrayPointer(kin_mem->kin_uscale);
  lVar11 = N_VGetArrayPointer(tmp2);
  N_VScale(0x3ff0000000000000,u,tmp2);
  lVar12 = sVar5 + sVar6 + 1;
  sVar16 = sVar4;
  if (lVar12 < sVar4) {
    sVar16 = lVar12;
  }
  lVar13 = 0;
  if (0 < sVar16) {
    lVar13 = sVar16;
  }
  lVar19 = 1;
  local_98 = 0;
  while( true ) {
    if (lVar19 == lVar13 + 1) {
      plVar1 = (long *)((long)pvVar2 + 0x40);
      *plVar1 = *plVar1 + sVar16;
      return 0;
    }
    j = lVar19 + -1;
    for (lVar14 = j; lVar14 < sVar4; lVar14 = lVar14 + lVar12) {
      dVar20 = ABS(*(double *)(lVar9 + lVar14 * 8));
      dVar21 = 1.0 / ABS(*(double *)(lVar10 + lVar14 * 8));
      if (dVar20 <= dVar21) {
        dVar20 = dVar21;
      }
      *(double *)(lVar11 + lVar14 * 8) =
           dVar20 * kin_mem->kin_sqrt_relfunc + *(double *)(lVar11 + lVar14 * 8);
    }
    iVar3 = (*kin_mem->kin_func)(tmp2,tmp1,kin_mem->kin_user_data);
    lVar14 = local_98;
    if (iVar3 != 0) break;
    for (; j < sVar4; j = j + lVar12) {
      *(undefined8 *)(lVar11 + j * 8) = *(undefined8 *)(lVar9 + j * 8);
      psVar15 = SUNBandMatrix_Column(Jac,j);
      dVar20 = ABS(*(double *)(lVar9 + j * 8));
      dVar21 = 1.0 / ABS(*(double *)(lVar10 + j * 8));
      if (dVar20 <= dVar21) {
        dVar20 = dVar21;
      }
      dVar21 = kin_mem->kin_sqrt_relfunc;
      lVar17 = j - sVar5;
      if (lVar17 < 1) {
        lVar17 = 0;
      }
      lVar18 = sVar6 + j;
      if (sVar4 + -1 <= sVar6 + j) {
        lVar18 = sVar4 + -1;
      }
      for (; lVar17 <= lVar18; lVar17 = lVar17 + 1) {
        *(double *)((long)psVar15 + lVar17 * 8 + lVar14) =
             (*(double *)(lVar8 + lVar17 * 8) - *(double *)(lVar7 + lVar17 * 8)) *
             (1.0 / (dVar20 * dVar21));
      }
      lVar14 = lVar14 + ~(sVar5 + sVar6) * 8;
    }
    lVar19 = lVar19 + 1;
    local_98 = local_98 + -8;
  }
  return iVar3;
}

Assistant:

int kinLsBandDQJac(N_Vector u, N_Vector fu, SUNMatrix Jac, KINMem kin_mem,
                   N_Vector tmp1, N_Vector tmp2)
{
  sunrealtype inc, inc_inv;
  N_Vector futemp, utemp;
  sunindextype group, i, j, width, ngroups, i1, i2;
  sunindextype N, mupper, mlower;
  sunrealtype *col_j, *fu_data, *futemp_data, *u_data, *utemp_data, *uscale_data;
  KINLsMem kinls_mem;
  int retval = 0;

  /* access LsMem interface structure */
  kinls_mem = (KINLsMem)kin_mem->kin_lmem;

  /* access matrix dimensions */
  N      = SUNBandMatrix_Columns(Jac);
  mupper = SUNBandMatrix_UpperBandwidth(Jac);
  mlower = SUNBandMatrix_LowerBandwidth(Jac);

  /* Rename work vectors for use as temporary values of u and fu */
  futemp = tmp1;
  utemp  = tmp2;

  /* Obtain pointers to the data for ewt, fy, futemp, y, ytemp */
  fu_data     = N_VGetArrayPointer(fu);
  futemp_data = N_VGetArrayPointer(futemp);
  u_data      = N_VGetArrayPointer(u);
  uscale_data = N_VGetArrayPointer(kin_mem->kin_uscale);
  utemp_data  = N_VGetArrayPointer(utemp);

  /* Load utemp with u */
  N_VScale(ONE, u, utemp);

  /* Set bandwidth and number of column groups for band differencing */
  width   = mlower + mupper + 1;
  ngroups = SUNMIN(width, N);

  for (group = 1; group <= ngroups; group++)
  {
    /* Increment all utemp components in group */
    for (j = group - 1; j < N; j += width)
    {
      inc = kin_mem->kin_sqrt_relfunc *
            SUNMAX(SUNRabs(u_data[j]), ONE / SUNRabs(uscale_data[j]));
      utemp_data[j] += inc;
    }

    /* Evaluate f with incremented u */
    retval = kin_mem->kin_func(utemp, futemp, kin_mem->kin_user_data);
    if (retval != 0) { return (retval); }

    /* Restore utemp components, then form and load difference quotients */
    for (j = group - 1; j < N; j += width)
    {
      utemp_data[j] = u_data[j];
      col_j         = SUNBandMatrix_Column(Jac, j);
      inc           = kin_mem->kin_sqrt_relfunc *
            SUNMAX(SUNRabs(u_data[j]), ONE / SUNRabs(uscale_data[j]));
      inc_inv = ONE / inc;
      i1      = SUNMAX(0, j - mupper);
      i2      = SUNMIN(j + mlower, N - 1);
      for (i = i1; i <= i2; i++)
      {
        SM_COLUMN_ELEMENT_B(col_j, i, j) = inc_inv *
                                           (futemp_data[i] - fu_data[i]);
      }
    }
  }

  /* Increment counter nfeDQ */
  kinls_mem->nfeDQ += ngroups;

  return (0);
}